

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liveglsl_tests.cpp
# Opt level: O2

void utest_filewatcher_add_watch_modify_1(int *utest_result,size_t utest_index)

{
  HFileWatcher handle;
  char *pcVar1;
  bool callback_called;
  duration<long,_std::ratio<1L,_1000L>_> local_218;
  ofstream file;
  
  std::ofstream::ofstream((ostream *)&file,"test_file.txt",_S_out);
  std::operator<<((ostream *)&file,"File dummy content");
  std::ofstream::close();
  callback_called = false;
  handle = FileWatcherCreate(OnFileChanged,&callback_called,0x10);
  FileWatcherAddWatch(handle,"test_file.txt");
  local_218.__r = 100;
  std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_218);
  if (callback_called == true) {
    if (utest_state.output != (FILE *)0x0) {
      fprintf((FILE *)utest_state.output,"%s:%u: Failure\n",
              "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/tests/liveglsl_tests.cpp"
              ,0x5b);
    }
    printf("%s:%u: Failure\n",
           "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/tests/liveglsl_tests.cpp"
           ,0x5b);
    if (utest_state.output != (FILE *)0x0) {
      fwrite("  Expected : true\n",0x12,1,(FILE *)utest_state.output);
    }
    puts("  Expected : true");
    if (utest_state.output != (FILE *)0x0) {
      pcVar1 = "true";
      if (callback_called != false) {
        pcVar1 = "false";
      }
      fprintf((FILE *)utest_state.output,"    Actual : %s\n",pcVar1);
    }
    pcVar1 = "true";
    if (callback_called != false) {
      pcVar1 = "false";
    }
    printf("    Actual : %s\n",pcVar1);
    *utest_result = 1;
  }
  FileWatcherRemoveWatch(handle,"test_file.txt");
  FileWatcherDestroy(handle);
  remove("test_file.txt");
  std::ofstream::~ofstream(&file);
  return;
}

Assistant:

UTEST(filewatcher, add_watch_modify_1) {
    const char* file_path = "test_file.txt";
    std::ofstream file(file_path);
    file << "File dummy content";
    file.close();

    bool callback_called = false;
    HFileWatcher watcher = FileWatcherCreate(OnFileChanged, &callback_called, 16);
    FileWatcherAddWatch(watcher, file_path);

    std::this_thread::sleep_for(std::chrono::milliseconds(100));

    T(!callback_called);

    FileWatcherRemoveWatch(watcher, file_path);
    FileWatcherDestroy(watcher);

    std::remove(file_path);
}